

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchedMatmulLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  bool bVar4;
  LogMessage *pLVar5;
  long *plVar6;
  size_type *psVar7;
  undefined1 *weights;
  Result *_result;
  int iVar8;
  int iVar9;
  undefined1 *puVar10;
  string err_1;
  string err;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [56];
  undefined1 local_110 [56];
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  if ((((layer->input_).super_RepeatedPtrFieldBase.current_size_ == 2) &&
      ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ == 2)) &&
     ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_148,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    iVar8 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                    0x24);
    if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_148,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    iVar9 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[1] +
                    0x24);
    if ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_d8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_148,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
    }
    iVar2 = *(int *)((long)((layer->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                    0x24);
    if (iVar9 < iVar8) {
      iVar9 = iVar8;
    }
    iVar8 = 2;
    if (2 < iVar9) {
      iVar8 = iVar9;
    }
    if (iVar2 != iVar8) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     "BatchedMatMul layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      plVar6 = (long *)std::__cxx11::string::append((char *)local_110);
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar7) {
        local_148._16_8_ = *psVar7;
        local_148._24_8_ = plVar6[3];
        local_148._0_8_ = local_148 + 0x10;
      }
      else {
        local_148._16_8_ = *psVar7;
        local_148._0_8_ = (size_type *)*plVar6;
      }
      local_148._8_8_ = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_148);
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      if (iVar2 != iVar8) {
        return __return_storage_ptr__;
      }
    }
  }
  if ((((layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
      ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ == 1)) &&
     ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         ((LogMessage *)local_110,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_148,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_110);
    }
    iVar8 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                    0x24);
    if ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         ((LogMessage *)local_148,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_188,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_148);
    }
    iVar9 = *(int *)((long)((layer->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                    0x24);
    if (iVar9 != iVar8) {
      std::operator+(&local_168,"BatchedMatMul layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_168);
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_188.field_2._M_allocated_capacity = *psVar7;
        local_188.field_2._8_8_ = plVar6[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = *psVar7;
        local_188._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_188._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if (iVar9 != iVar8) {
        return __return_storage_ptr__;
      }
    }
  }
  iVar8 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
  if (1 < iVar8) {
    if (layer->_oneof_case_[0] == 0x415) {
      puVar10 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar10 = Specification::_BatchedMatMulLayerParams_default_instance_;
    }
    if (((BatchedMatMulLayerParams *)puVar10)->hasbias_ == true) {
      std::operator+(&local_168,"BatchedMatMul layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_168);
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_188.field_2._M_allocated_capacity = *psVar7;
        local_188.field_2._8_8_ = plVar6[3];
      }
      else {
        local_188.field_2._M_allocated_capacity = *psVar7;
        local_188._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_188._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_188);
LAB_0036765c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p == &local_188.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    if (1 < iVar8) {
      if (layer->_oneof_case_[0] == 0x415) {
        puVar10 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar10 = Specification::_BatchedMatMulLayerParams_default_instance_;
      }
      if (((BatchedMatMulLayerParams *)puVar10)->int8dynamicquantize_ == true) {
        std::operator+(&local_168,"BatchedMatMul layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_168);
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_188.field_2._M_allocated_capacity = *psVar7;
          local_188.field_2._8_8_ = plVar6[3];
        }
        else {
          local_188.field_2._M_allocated_capacity = *psVar7;
          local_188._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_188._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_188);
        goto LAB_0036765c;
      }
    }
  }
  if (layer->_oneof_case_[0] == 0x415) {
    puVar10 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar10 = Specification::_BatchedMatMulLayerParams_default_instance_;
  }
  if (((BatchedMatMulLayerParams *)puVar10)->int8dynamicquantize_ == true) {
    puVar10 = (undefined1 *)(((ActivationParams *)puVar10)->NonlinearityType_).linear_;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"BatchedMatMul","");
    if ((WeightParams *)puVar10 == (WeightParams *)0x0) {
      puVar10 = Specification::_WeightParams_default_instance_;
    }
    validateInt8Requirements
              (__return_storage_ptr__,(WeightParams *)puVar10,&local_188,
               (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Result::good(__return_storage_ptr__);
    if (!bVar4) {
      return __return_storage_ptr__;
    }
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (!bVar4) {
      return __return_storage_ptr__;
    }
  }
  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1) {
    if (layer->_oneof_case_[0] == 0x415) {
      puVar10 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar10 = Specification::_BatchedMatMulLayerParams_default_instance_;
    }
    weights = (undefined1 *)(((ActivationParams *)puVar10)->NonlinearityType_).linear_;
    if ((WeightParams *)weights == (WeightParams *)0x0) {
      weights = Specification::_WeightParams_default_instance_;
    }
    puVar10 = (undefined1 *)((InnerProductLayerParams *)puVar10)->bias_;
    if ((WeightParams *)puVar10 == (WeightParams *)0x0) {
      puVar10 = Specification::_WeightParams_default_instance_;
    }
    validateInnerProductWeightsBias
              (__return_storage_ptr__,layer,(WeightParams *)weights,(WeightParams *)puVar10);
    bVar4 = Result::good(__return_storage_ptr__);
    if (!bVar4) {
      return __return_storage_ptr__;
    }
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (!bVar4) {
      return __return_storage_ptr__;
    }
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchedMatmulLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    // validate rank, if present
    if (layer.input_size() == 2 && layer.inputtensor_size() == 2 && layer.outputtensor_size() == 1) {
        int in1_rank = static_cast<int>(layer.inputtensor(0).rank());
        int in2_rank = static_cast<int>(layer.inputtensor(1).rank());
        int out_rank = static_cast<int>(layer.outputtensor(0).rank());
        if (out_rank != std::max(2, std::max(in1_rank, in2_rank))) {
            std::string err = "BatchedMatMul layer '" + layer.name() + "': given ranks of the two inputs, rank of the output is incorrect.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    if (layer.input_size() == 1 && layer.inputtensor_size() == 1 && layer.outputtensor_size() == 1) {
        int in_rank = static_cast<int>(layer.inputtensor(0).rank());
        int out_rank = static_cast<int>(layer.outputtensor(0).rank());
        if (out_rank != in_rank) {
            std::string err = "BatchedMatMul layer '" + layer.name() + "': has one input, in this case, output and input ranks must be equal but they are not.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    if (layer.input_size() > 1 && layer.batchedmatmul().hasbias()) {
        std::string err = "BatchedMatMul layer '" + layer.name() + "': has two inputs and 'hasBias' flag is set to True."
                                "However, bias is only supported when the layer has 1 input.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.input_size() > 1 && layer.batchedmatmul().int8dynamicquantize()) {
        std::string err = "BatchedMatMul layer '" + layer.name() + "': cannot use dynamic quantization with 2 inputs.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.batchedmatmul().int8dynamicquantize()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInt8Requirements(layer.batchedmatmul().weights(), "BatchedMatMul", layer.name()));
    }

    if (layer.input_size() == 1) {
        const auto& params = layer.batchedmatmul();
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInnerProductWeightsBias(layer, params.weights(), params.bias()));
    }

    return Result();
}